

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O1

void __thiscall
Saturation::ConsequenceFinder::onNewPropositionalClause(ConsequenceFinder *this,Clause *cl)

{
  uint uVar1;
  Literal *pLVar2;
  uint *puVar3;
  undefined8 *puVar4;
  bool bVar5;
  Clause *pCVar6;
  ostream *poVar7;
  uint uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  Literal **ppLVar12;
  ulong uVar13;
  Literal **ppLVar14;
  Literal *pLVar15;
  Literal *pLVar16;
  string local_50;
  
  pCVar6 = Inferences::DuplicateLiteralRemovalISE::simplify(&this->_dlr,cl);
  if (pCVar6 != cl) {
    Kernel::Clause::destroyIfUnnecessary(pCVar6);
    return;
  }
  bVar5 = Kernel::Clause::noSplits(cl);
  if ((bVar5) &&
     (pCVar6 = Inferences::TautologyDeletionISE::simplify(&this->_td,cl), pCVar6 != (Clause *)0x0))
  {
    pLVar16 = (Literal *)0x0;
    uVar8 = *(uint *)&cl->field_0x38 & 0xfffff;
    bVar5 = uVar8 == 0;
    if (bVar5) {
      bVar11 = 1;
    }
    else {
      ppLVar14 = cl->_literals;
      uVar13 = (ulong)!bVar5;
      ppLVar12 = cl->_literals + uVar13;
      bVar10 = 1;
      bVar11 = 1;
      do {
        pLVar2 = *ppLVar14;
        uVar1 = *(uint *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) +
                                   (ulong)(pLVar2->super_Term)._functor * 8) + 0x40);
        if ((uVar1 & 0x20) != 0) {
          pLVar15 = pLVar16;
          if (pLVar16 == (Literal *)0x0) {
            pLVar15 = pLVar2;
          }
          bVar9 = 0;
          if (pLVar16 == (Literal *)0x0) {
            bVar9 = bVar10;
          }
          bVar11 = bVar10;
          if (((pLVar2->super_Term)._args[0]._content & 4) != 0) {
            pLVar16 = pLVar15;
            bVar11 = bVar9;
            bVar10 = bVar9;
          }
        }
        if ((uVar1 & 0x20) == 0) break;
        uVar1 = (uint)uVar13;
        ppLVar14 = (Literal **)0x0;
        if (uVar1 < uVar8) {
          ppLVar14 = ppLVar12;
        }
        ppLVar12 = ppLVar12 + 1;
        bVar5 = uVar8 <= uVar1;
        uVar13 = (ulong)(uVar1 + 1);
      } while (uVar1 < uVar8);
    }
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Pure cf clause: ",0x10);
      Kernel::Clause::toNiceString_abi_cxx11_(&local_50,cl);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((bool)(bVar11 & pLVar16 != (Literal *)0x0)) {
        uVar8 = (pLVar16->super_Term)._functor;
        uVar13 = (ulong)uVar8;
        if ((this->_redundant).super_Array<bool>._capacity <= uVar13) {
          ::Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,uVar13);
        }
        if ((this->_redundant).super_Array<bool>._array[uVar13] == false) {
          if ((this->_redundant).super_Array<bool>._capacity <= uVar13) {
            ::Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,uVar13);
          }
          (this->_redundant).super_Array<bool>._array[uVar13] = true;
          if ((this->_redundantsToHandle)._cursor == (this->_redundantsToHandle)._end) {
            ::Lib::Stack<unsigned_int>::expand(&this->_redundantsToHandle);
          }
          puVar3 = (this->_redundantsToHandle)._cursor;
          *puVar3 = uVar8;
          (this->_redundantsToHandle)._cursor = puVar3 + 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Consequence found: ",0x13);
          puVar4 = *(undefined8 **)(*(long *)(DAT_00b7e1b0 + 0x80) + (long)(int)uVar8 * 8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)*puVar4,puVar4[1]);
          std::endl<char,std::char_traits<char>>(poVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void ConsequenceFinder::onNewPropositionalClause(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  //remove duplicate literals (necessary for tautology deletion)
  Clause* dlrCl=_dlr.simplify(cl);

  bool dlrSimplified=dlrCl!=cl;
  if(dlrSimplified) {
    //the function will be called again with the clause that is already simplified
    //TODO: get some cheaper way of testing for duplicate literals presence
    dlrCl->destroyIfUnnecessary();
    return;
  }


  if(!cl->noSplits() || !_td.simplify(cl)) {
    return;
  }
  Literal* pos=0;
  bool horn=true;
  for (auto l : cl->iterLits()) {
    if(!env.signature->getPredicate(l->functor())->label()) {
      return;
    }
    if(l->isPositive()) {
      if(pos) {
        horn=false;
      }
      else {
        pos=l;
      }
    }
  }

  std::cout << "Pure cf clause: " << cl->toNiceString() <<endl;

  if(!horn || !pos) {
    return;
  }

  unsigned red=pos->functor(); //redundant cf symbol number
  if(_redundant[red]) {
    return;
  }
  _redundant[red]=true;

  //we will remove the redundant clauses later -- now we may be at some unsuitable part
  //of the saturation algorithm loop
  _redundantsToHandle.push(red);

  std::cout << "Consequence found: " << env.signature->predicateName(red) << endl;
}